

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

void __thiscall
libtorrent::url_seed_alert::url_seed_alert
          (url_seed_alert *this,stack_allocator *alloc,torrent_handle *h,string_view u,string_view m
          )

{
  allocation_slot aVar1;
  char *local_30;
  size_t local_28;
  
  local_28 = u.len_;
  local_30 = u.ptr_;
  torrent_alert::torrent_alert(&this->super_torrent_alert,alloc,h);
  (this->super_torrent_alert).super_alert._vptr_alert = (_func_int **)&PTR__url_seed_alert_00431e70;
  (this->error).val_ = 0;
  (this->error).failed_ = false;
  (this->error).cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  aVar1 = aux::stack_allocator::copy_string(alloc,u);
  (this->m_url_idx).m_idx = aVar1.m_idx;
  aVar1 = aux::stack_allocator::copy_string(alloc,m);
  (this->m_msg_idx).m_idx = aVar1.m_idx;
  boost::basic_string_view::operator_cast_to_string(&this->url,(basic_string_view *)&local_30);
  boost::basic_string_view::operator_cast_to_string(&this->msg,(basic_string_view *)&m);
  return;
}

Assistant:

url_seed_alert::url_seed_alert(aux::stack_allocator& alloc, torrent_handle const& h
		, string_view u, string_view m)
		: torrent_alert(alloc, h)
		, m_url_idx(alloc.copy_string(u))
		, m_msg_idx(alloc.copy_string(m))
#if TORRENT_ABI_VERSION == 1
		, url(u)
		, msg(m)
#endif
	{}